

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng-bt.c
# Opt level: O0

int lell_pcapng_append_packet
              (lell_pcapng_handle *h,uint64_t ns,int8_t sigdbm,int8_t noisedbm,uint32_t refAA,
              lell_packet *pkt)

{
  ushort uVar1;
  uint uVar2;
  PCAPNG_RESULT PVar3;
  ushort uVar4;
  undefined1 local_b3 [3];
  int retval;
  pcapng_le_packet pcapng_pkt;
  uint16_t flags;
  lell_packet *pkt_local;
  uint32_t refAA_local;
  int8_t noisedbm_local;
  int8_t sigdbm_local;
  uint64_t ns_local;
  lell_pcapng_handle *h_local;
  
  uVar1 = 0;
  if (noisedbm < sigdbm) {
    uVar1 = 4;
  }
  unique0x10000113 = pkt;
  uVar2 = lell_packet_is_data(pkt);
  uVar4 = 0x10;
  if (uVar2 != 0) {
    uVar4 = 0;
  }
  pcapng_pkt.options._0_2_ = uVar1 | 0x23 | uVar4;
  assemble_pcapng_le_packet
            ((pcapng_le_packet *)local_b3,0,ns,stack0xffffffffffffffc8->length + 9,
             stack0xffffffffffffffc8->channel_k,sigdbm,noisedbm,
             (uint8_t)stack0xffffffffffffffc8->access_address_offenses,refAA,
             (ushort)pcapng_pkt.options,stack0xffffffffffffffc8->symbols);
  PVar3 = append_le_packet((PCAPNG_HANDLE *)h,(pcapng_le_packet *)local_b3);
  if (-PVar3 == 0) {
    uVar2 = lell_packet_is_data(stack0xffffffffffffffc8);
    if ((uVar2 == 0) && (stack0xffffffffffffffc8->adv_type == '\x05')) {
      lell_pcapng_record_connect_req(h,ns,stack0xffffffffffffffc8->symbols);
    }
  }
  return -PVar3;
}

Assistant:

int
lell_pcapng_append_packet(lell_pcapng_handle * h, const uint64_t ns,
			  const int8_t sigdbm, const int8_t noisedbm,
			  const uint32_t refAA, const lell_packet *pkt)
{
	uint16_t flags = LE_DEWHITENED | LE_AA_OFFENSES_VALID |
		LE_SIGPOWER_VALID |
		((noisedbm < sigdbm) ? LE_NOISEPOWER_VALID : 0) |
		(lell_packet_is_data(pkt) ? 0 : LE_REF_AA_VALID);
	pcapng_le_packet pcapng_pkt;

	/* The extra 9 bytes added to the packet length are for:
	   4 bytes for Access Address
	   2 bytes for PDU header
	   3 bytes for CRC */
	assemble_pcapng_le_packet( &pcapng_pkt,
				   0,
				   ns,
				   9+pkt->length,
				   pkt->channel_k,
				   sigdbm,
				   noisedbm,
				   pkt->access_address_offenses,
				   refAA,
				   flags,
				   &pkt->symbols[0] );
	int retval = -append_le_packet( (PCAPNG_HANDLE *) h, &pcapng_pkt );
	if ((retval == 0) && !lell_packet_is_data(pkt) && (pkt->adv_type == CONNECT_REQ)) {
		(void) lell_pcapng_record_connect_req(h, ns, &pkt->symbols[0]);
	}
	return retval;
}